

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# direct_bit_encoder.h
# Opt level: O2

void __thiscall draco::DirectBitEncoder::EncodeBit(DirectBitEncoder *this,bool bit)

{
  uint32_t uVar1;
  undefined7 in_register_00000031;
  
  if ((int)CONCAT71(in_register_00000031,bit) != 0) {
    this->local_bits_ = this->local_bits_ | 0x80000000U >> ((byte)this->num_local_bits_ & 0x1f);
  }
  uVar1 = this->num_local_bits_ + 1;
  this->num_local_bits_ = uVar1;
  if (uVar1 == 0x20) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (&this->bits_,&this->local_bits_);
    this->local_bits_ = 0;
    this->num_local_bits_ = 0;
  }
  return;
}

Assistant:

void EncodeBit(bool bit) {
    if (bit) {
      local_bits_ |= 1 << (31 - num_local_bits_);
    }
    num_local_bits_++;
    if (num_local_bits_ == 32) {
      bits_.push_back(local_bits_);
      num_local_bits_ = 0;
      local_bits_ = 0;
    }
  }